

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  string_view str;
  iterator this_00;
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  string *psVar4;
  size_t sVar5;
  SourceFileFlags SVar6;
  bool stripResources;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue location;
  _Self local_30;
  iterator si;
  cmSourceFile *sf_local;
  cmGeneratorTarget *this_local;
  SourceFileFlags flags;
  
  si._M_node = (_Base_ptr)sf;
  SourceFileFlags::SourceFileFlags((SourceFileFlags *)&this_local);
  ConstructSourceFileFlags(this);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
       ::find(&this->SourceFlagsMap,(key_type *)&si);
  location.Value =
       (string *)
       std::
       map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
       ::end(&this->SourceFlagsMap);
  bVar1 = std::operator!=(&local_30,(_Self *)&location);
  this_00 = si;
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>
             ::operator->(&local_30);
    this_local = *(cmGeneratorTarget **)&ppVar3->second;
    flags._0_8_ = (ppVar3->second).MacFolder;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"MACOSX_PACKAGE_LOCATION",&local_61);
    local_40 = cmSourceFile::GetProperty((cmSourceFile *)this_00._M_node,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar1 = cmValue::operator_cast_to_bool(&local_40);
    if (bVar1) {
      cmValue::operator->[abi_cxx11_(&local_40);
      flags._0_8_ = std::__cxx11::string::c_str();
      uVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x30])
                        (this->GlobalGenerator,this->Makefile);
      psVar4 = cmValue::operator*[abi_cxx11_(&local_40);
      bVar1 = std::operator==(psVar4,"Resources");
      if (bVar1) {
        this_local = (cmGeneratorTarget *)0x3;
        if ((uVar2 & 1) != 0) {
          flags._0_8_ = (long)"PK\x01\x02" + 4;
        }
      }
      else {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_40);
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
        bVar1 = cmHasLiteralPrefix<11ul>(str,(char (*) [11])"Resources/");
        if (bVar1) {
          this_local = (cmGeneratorTarget *)CONCAT44(this_local._4_4_,4);
          if ((uVar2 & 1) != 0) {
            sVar5 = cmStrLen<11ul>((char (*) [11])"Resources/");
            flags._0_8_ = sVar5 + flags._0_8_;
          }
        }
        else {
          this_local = (cmGeneratorTarget *)0x5;
        }
      }
    }
  }
  SVar6._0_8_ = (ulong)this_local & 0xffffffff;
  SVar6.MacFolder = (char *)flags._0_8_;
  return SVar6;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  auto si = this->SourceFlagsMap.find(sf);
  if (si != this->SourceFlagsMap.end()) {
    flags = si->second;
  } else {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if (cmValue location = sf->GetProperty("MACOSX_PACKAGE_LOCATION")) {
      flags.MacFolder = location->c_str();
      const bool stripResources =
        this->GlobalGenerator->ShouldStripResourcePath(this->Makefile);
      if (*location == "Resources") {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        if (stripResources) {
          flags.MacFolder = "";
        }
      } else if (cmHasLiteralPrefix(*location, "Resources/")) {
        flags.Type = cmGeneratorTarget::SourceFileTypeDeepResource;
        if (stripResources) {
          flags.MacFolder += cmStrLen("Resources/");
        }
      } else {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
      }
    }
  }
  return flags;
}